

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

void __thiscall masc::polygon::c_ply::reverse(c_ply *this)

{
  ply_vertex *ppVar1;
  pointer pppVar2;
  int iVar3;
  undefined4 extraout_var;
  ply_vertex *this_00;
  
  this_00 = this->head;
  do {
    ppVar1 = this_00->next;
    this_00->next = this_00->pre;
    this_00->pre = ppVar1;
    ply_vertex::computeExtraInfo(this_00);
    iVar3 = (*this_00->_vptr_ply_vertex[3])(this_00);
    this_00 = (ply_vertex *)CONCAT44(extraout_var,iVar3);
  } while (this_00 != this->head);
  this->area = -this->area;
  pppVar2 = (this->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar2) {
    (this->all).
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar2;
  }
  return;
}

Assistant:

void c_ply::reverse()
{
    ply_vertex * ptr=head;
    do{
        ptr->reverse();
        ptr=ptr->getNext();
    }
    while(ptr!=head); //end while

    this->area=-this->area;
    all.clear();
}